

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

void collectCustomLayerNamesAndDescriptions
               (Model *model,
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *output)

{
  uint32 uVar1;
  Rep *pRVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__a;
  Pipeline *pPVar3;
  PipelineRegressor *pPVar4;
  PipelineClassifier *pPVar5;
  RepeatedPtrFieldBase *this;
  Type *this_00;
  CustomLayerParams *pCVar6;
  int iVar7;
  long lVar8;
  void **ppvVar9;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  uVar1 = model->_oneof_case_[0];
  if (uVar1 == 200) {
    pPVar5 = CoreML::Specification::Model::pipelineclassifier(model);
    pPVar3 = pPVar5->pipeline_;
    if (pPVar3 == (Pipeline *)0x0) {
      pPVar3 = (Pipeline *)&CoreML::Specification::_Pipeline_default_instance_;
    }
    pRVar2 = (pPVar3->models_).super_RepeatedPtrFieldBase.rep_;
    ppvVar9 = pRVar2->elements;
    if (pRVar2 == (Rep *)0x0) {
      ppvVar9 = (void **)0x0;
    }
    iVar7 = (pPVar3->models_).super_RepeatedPtrFieldBase.current_size_;
    for (lVar8 = 0; (long)iVar7 * 8 != lVar8; lVar8 = lVar8 + 8) {
      collectCustomLayerNamesAndDescriptions(*(Model **)((long)ppvVar9 + lVar8),output);
    }
  }
  else if (uVar1 == 0xc9) {
    pPVar4 = CoreML::Specification::Model::pipelineregressor(model);
    pPVar3 = pPVar4->pipeline_;
    if (pPVar3 == (Pipeline *)0x0) {
      pPVar3 = (Pipeline *)&CoreML::Specification::_Pipeline_default_instance_;
    }
    pRVar2 = (pPVar3->models_).super_RepeatedPtrFieldBase.rep_;
    ppvVar9 = pRVar2->elements;
    if (pRVar2 == (Rep *)0x0) {
      ppvVar9 = (void **)0x0;
    }
    iVar7 = (pPVar3->models_).super_RepeatedPtrFieldBase.current_size_;
    for (lVar8 = 0; (long)iVar7 * 8 != lVar8; lVar8 = lVar8 + 8) {
      collectCustomLayerNamesAndDescriptions(*(Model **)((long)ppvVar9 + lVar8),output);
    }
  }
  else if (uVar1 == 0xca) {
    pPVar3 = CoreML::Specification::Model::pipeline(model);
    pRVar2 = (pPVar3->models_).super_RepeatedPtrFieldBase.rep_;
    ppvVar9 = pRVar2->elements;
    if (pRVar2 == (Rep *)0x0) {
      ppvVar9 = (void **)0x0;
    }
    iVar7 = (pPVar3->models_).super_RepeatedPtrFieldBase.current_size_;
    for (lVar8 = 0; (long)iVar7 * 8 != lVar8; lVar8 = lVar8 + 8) {
      collectCustomLayerNamesAndDescriptions(*(Model **)((long)ppvVar9 + lVar8),output);
    }
  }
  else {
    this = &getNNSpec(model)->super_RepeatedPtrFieldBase;
    if (this != (RepeatedPtrFieldBase *)0x0) {
      for (iVar7 = 0; iVar7 < this->current_size_; iVar7 = iVar7 + 1) {
        this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                            (this,iVar7);
        if (this_00->_oneof_case_[0] == 500) {
          pCVar6 = CoreML::Specification::NeuralNetworkLayer::custom(this_00);
          __a = (pCVar6->classname_).ptr_;
          pCVar6 = CoreML::Specification::NeuralNetworkLayer::custom(this_00);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    (&local_70,__a,(pCVar6->description_).ptr_);
          std::
          vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
          ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                      *)output,&local_70);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair(&local_70);
        }
      }
    }
  }
  return;
}

Assistant:

inline void collectCustomLayerNamesAndDescriptions(const Specification::Model &model, std::vector<StringPair> *output) {

    switch (model.Type_case()) {
        case Specification::Model::kPipeline:
            for (auto &m : model.pipeline().models()) {
                collectCustomLayerNamesAndDescriptions(m,output);
            }
            break;
        case Specification::Model::kPipelineRegressor:
            for (auto &m : model.pipelineregressor().pipeline().models()) {
                collectCustomLayerNamesAndDescriptions(m,output);
            }
            break;
        case Specification::Model::kPipelineClassifier:
            for (auto &m : model.pipelineclassifier().pipeline().models()) {
                collectCustomLayerNamesAndDescriptions(m,output);
            }
            break;
        default:
            auto layers = getNNSpec(model);
            if (layers) {
                for (int i =0; i< layers->size(); i++){
                    const Specification::NeuralNetworkLayer& layer = (*layers)[i];
                    if (layer.layer_case() == Specification::NeuralNetworkLayer::kCustom) {
                        output->push_back(std::make_pair(layer.custom().classname(), layer.custom().description()));
                    }
                }
            }
            break;
        }
}